

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

var __thiscall cs::runtime_type::get_string_literal(runtime_type *this,string *data,string *literal)

{
  size_t sVar1;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_cs::callable>_>
  pcVar2;
  runtime_error *this_00;
  key_arg<std::__cxx11::basic_string<char>_> *in_RCX;
  initializer_list<cs_impl::any> __l;
  vector arg;
  allocator_type local_49;
  any local_48;
  undefined1 local_40 [32];
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
                      *)data,in_RCX);
  if (sVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_40._0_8_ = local_40 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Undefined String Literal.","");
    runtime_error::runtime_error(this_00,(string *)local_40);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  cs_impl::any::any<std::__cxx11::string>(&local_48,literal);
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_40,__l,&local_49);
  cs_impl::any::recycle(&local_48);
  pcVar2 = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
           ::
           at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
                       *)data,in_RCX);
  if ((pcVar2->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(pcVar2->mFunc)._M_invoker)
              ((_Any_data *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar2);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_40);
    return (var)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

var get_string_literal(const std::string &data, const std::string &literal)
		{
			if (literals.count(literal) > 0) {
				vector arg{data};
				return literals.at(literal).call(arg);
			}
			else
				throw runtime_error("Undefined String Literal.");
		}